

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

int Abs_ManSupport3(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  int *piVar13;
  int Entry;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  
  Abs_ManSupport2(p,pObj,vSupp);
  uVar8 = Abs_GiaSortNodes(p,vSupp);
  if ((int)uVar8 < 1) {
    __assert_fail("nSize0 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x218,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  uVar9 = vSupp->nSize;
  if ((int)uVar9 < 1) {
    return uVar9;
  }
LAB_00577111:
  uVar12 = (ulong)uVar9;
  piVar11 = vSupp->pArray;
  uVar15 = 1;
  if (1 < (int)uVar9) {
    uVar15 = (ulong)uVar9;
  }
  uVar16 = 0;
  do {
    iVar18 = piVar11[uVar16];
    lVar14 = (long)iVar18;
    if (lVar14 < 0) {
LAB_00577620:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    iVar4 = p->nObjs;
    if (iVar4 <= iVar18) goto LAB_00577620;
    pGVar6 = p->pObjs;
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      return uVar9;
    }
    if (uVar8 <= uVar16) {
      pGVar1 = pGVar6 + lVar14;
      uVar7 = *(ulong *)pGVar1;
      if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
        if ((uVar7 >> 0x3e & 1) != 0) {
          __assert_fail("!pTemp->fMark1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x223,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        if (iVar4 <= iVar18) goto LAB_0057763f;
        if (p->pRefs[lVar14] < 1) {
          __assert_fail("Gia_ObjRefNum(p, pTemp) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x224,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        pGVar2 = pGVar1 + -(uVar7 & 0x1fffffff);
        if ((pGVar2 < pGVar6) || (pGVar3 = pGVar6 + iVar4, pGVar3 <= pGVar2)) goto LAB_0057763f;
        Entry = (int)((long)pGVar2 - (long)pGVar6 >> 2) * -0x55555555;
        iVar4 = p->nTravIdsAlloc;
        if (iVar4 <= Entry) goto LAB_0057765e;
        pGVar1 = pGVar1 + -(ulong)((uint)(uVar7 >> 0x20) & 0x1fffffff);
        piVar13 = p->pTravIds;
        iVar5 = p->nTravIds;
        if (piVar13[Entry] == iVar5) {
          if ((pGVar1 < pGVar6) || (pGVar3 <= pGVar1)) goto LAB_0057763f;
          iVar17 = (int)((long)pGVar1 - (long)pGVar6 >> 2) * -0x55555555;
          if (iVar4 <= iVar17) goto LAB_0057765e;
          if (piVar13[iVar17] == iVar5) {
            if (*piVar11 == iVar18) {
              bVar19 = true;
              uVar12 = 0;
              goto LAB_005774c8;
            }
            uVar15 = 0;
            break;
          }
          if (piVar13[Entry] == iVar5) {
            if (*piVar11 == iVar18) {
              bVar19 = true;
              uVar12 = 0;
              goto LAB_0057751a;
            }
            uVar15 = 0;
            goto LAB_005774a9;
          }
        }
        if ((pGVar1 < pGVar6) || (pGVar3 <= pGVar1)) goto LAB_0057763f;
        iVar17 = (int)((long)pGVar1 - (long)pGVar6 >> 2) * -0x55555555;
        if (iVar4 <= iVar17) goto LAB_0057765e;
        if (piVar13[iVar17] == iVar5) goto LAB_005772e3;
      }
    }
    uVar16 = uVar16 + 1;
    if (uVar15 == uVar16) {
      return uVar9;
    }
  } while( true );
  while (uVar16 = uVar15 + 1, lVar14 = uVar15 + 1, uVar15 = uVar16, piVar11[lVar14] != iVar18) {
    if (uVar12 - 1 == uVar15) {
      bVar19 = false;
      goto LAB_005774c8;
    }
  }
  bVar19 = uVar16 < uVar12;
  uVar12 = uVar16;
LAB_005774c8:
  if ((uint)uVar12 != uVar9) {
    if (!bVar19) goto LAB_005776da;
    uVar10 = (uint)uVar12 + 1;
    if ((int)uVar10 < (int)uVar9) {
      piVar13 = piVar11 + uVar10;
      do {
        iVar18 = (int)uVar12;
        piVar11[uVar12 & 0xffffffff] = *piVar13;
        uVar9 = vSupp->nSize;
        piVar13 = piVar13 + 1;
        uVar12 = (ulong)(iVar18 + 1);
      } while (iVar18 + 2 < (int)uVar9);
    }
    vSupp->nSize = uVar9 - 1;
  }
  goto LAB_00577600;
  while (uVar16 = uVar15 + 1, lVar14 = uVar15 + 1, uVar15 = uVar16, piVar11[lVar14] != iVar18) {
LAB_005774a9:
    if (uVar12 - 1 == uVar15) {
      bVar19 = false;
      goto LAB_0057751a;
    }
  }
  bVar19 = uVar16 < uVar12;
  uVar12 = uVar16;
LAB_0057751a:
  if ((uint)uVar12 != uVar9) {
    if (!bVar19) goto LAB_005776da;
    uVar10 = (uint)uVar12 + 1;
    if ((int)uVar10 < (int)uVar9) {
      piVar13 = piVar11 + uVar10;
      do {
        iVar18 = (int)uVar12;
        piVar11[uVar12 & 0xffffffff] = *piVar13;
        uVar9 = vSupp->nSize;
        piVar13 = piVar13 + 1;
        uVar12 = (ulong)(iVar18 + 1);
      } while (iVar18 + 2 < (int)uVar9);
    }
    vSupp->nSize = uVar9 - 1;
  }
  if ((pGVar1 < pGVar6) || (pGVar6 + p->nObjs <= pGVar1)) goto LAB_0057763f;
  Vec_IntPush(vSupp,(int)((ulong)((long)pGVar1 - (long)pGVar6) >> 2) * -0x55555555);
  pGVar6 = p->pObjs;
  if ((pGVar1 < pGVar6) || (pGVar6 + p->nObjs <= pGVar1)) goto LAB_0057763f;
  iVar18 = (int)((long)pGVar1 - (long)pGVar6 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar18) goto LAB_0057765e;
  piVar11 = p->pTravIds;
  lVar14 = (long)iVar18;
  iVar18 = p->nTravIds;
  if (piVar11[lVar14] == iVar18) {
    __assert_fail("!Gia_ObjIsTravIdCurrent(p, pFan1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x231,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  goto LAB_005775f9;
LAB_005772e3:
  if (*piVar11 == iVar18) {
    bVar19 = true;
    uVar12 = 0;
  }
  else {
    uVar15 = 0;
    do {
      if (uVar12 - 1 == uVar15) {
        bVar19 = false;
        goto LAB_005773b1;
      }
      uVar16 = uVar15 + 1;
      lVar14 = uVar15 + 1;
      uVar15 = uVar16;
    } while (piVar11[lVar14] != iVar18);
    bVar19 = uVar16 < uVar12;
    uVar12 = uVar16;
  }
LAB_005773b1:
  if ((uint)uVar12 != uVar9) {
    if (!bVar19) {
LAB_005776da:
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x3c1,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    uVar10 = (uint)uVar12 + 1;
    if ((int)uVar10 < (int)uVar9) {
      piVar13 = piVar11 + uVar10;
      do {
        iVar18 = (int)uVar12;
        piVar11[uVar12 & 0xffffffff] = *piVar13;
        uVar9 = vSupp->nSize;
        piVar13 = piVar13 + 1;
        uVar12 = (ulong)(iVar18 + 1);
      } while (iVar18 + 2 < (int)uVar9);
    }
    vSupp->nSize = uVar9 - 1;
  }
  if (pGVar6 + p->nObjs <= pGVar2) {
LAB_0057763f:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  Vec_IntPush(vSupp,Entry);
  pGVar6 = p->pObjs;
  if ((pGVar2 < pGVar6) || (pGVar6 + p->nObjs <= pGVar2)) goto LAB_0057763f;
  iVar18 = (int)((long)pGVar2 - (long)pGVar6 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar18) {
LAB_0057765e:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar11 = p->pTravIds;
  lVar14 = (long)iVar18;
  iVar18 = p->nTravIds;
  if (piVar11[lVar14] == iVar18) {
    __assert_fail("!Gia_ObjIsTravIdCurrent(p, pFan0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x23a,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
LAB_005775f9:
  piVar11[lVar14] = iVar18;
LAB_00577600:
  uVar9 = vSupp->nSize;
  if ((int)uVar9 < 1) {
    return uVar9;
  }
  goto LAB_00577111;
}

Assistant:

int Abs_ManSupport3( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pTemp, * pFan0, * pFan1;
    int i, nSize0;
    // collect MFFC
    Abs_ManSupport2( p, pObj, vSupp );
    // move dominated to the front
    nSize0 = Abs_GiaSortNodes( p, vSupp );
    assert( nSize0 > 0 );
    // consider remaining nodes
    while ( 1 )
    {
        int fChanges = 0;
        Gia_ManForEachObjVec( vSupp, p, pTemp, i )
        {
            if ( i < nSize0 )
                continue;
            if ( !Gia_ObjIsAnd(pTemp) )
                continue;
            assert( !pTemp->fMark1 );
            assert( Gia_ObjRefNum(p, pTemp) > 0 );
            pFan0 = Gia_ObjFanin0(pTemp);
            pFan1 = Gia_ObjFanin1(pTemp);
            if ( Gia_ObjIsTravIdCurrent(p, pFan0) && Gia_ObjIsTravIdCurrent(p, pFan1) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                fChanges = 1;
                break;
            }
            if ( Gia_ObjIsTravIdCurrent(p, pFan0) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                Vec_IntPush( vSupp, Gia_ObjId(p, pFan1) );
                assert( !Gia_ObjIsTravIdCurrent(p, pFan1) );
                Gia_ObjSetTravIdCurrent(p, pFan1);
                fChanges = 1;
                break;
            }
            if ( Gia_ObjIsTravIdCurrent(p, pFan1) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                Vec_IntPush( vSupp, Gia_ObjId(p, pFan0) );
                assert( !Gia_ObjIsTravIdCurrent(p, pFan0) );
                Gia_ObjSetTravIdCurrent(p, pFan0);
                fChanges = 1;
                break;
            }
        }
        if ( !fChanges )
            break;
    }
    return Vec_IntSize(vSupp);
}